

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundCastExpression::Deserialize(BoundCastExpression *this,Deserializer *deserializer)

{
  BoundCastExpression *this_00;
  ClientContext *context;
  pointer pBVar1;
  pointer *__ptr;
  LogicalType return_type;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_78;
  undefined1 local_70 [8];
  _Head_base<0UL,_duckdb::BoundCastExpression_*,_false> local_68;
  LogicalType local_60;
  LogicalType local_48;
  
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((Deserializer *)local_70,(field_id_t)deserializer,(char *)0xc8);
  Deserializer::ReadProperty<duckdb::LogicalType>(&local_60,deserializer,0xc9,"return_type");
  this_00 = (BoundCastExpression *)operator_new(0x80);
  context = SerializationData::Get<duckdb::ClientContext&>(&deserializer->data);
  local_78._M_head_impl = (Expression *)local_70;
  local_70 = (undefined1  [8])0x0;
  LogicalType::LogicalType(&local_48,&local_60);
  BoundCastExpression(this_00,context,
                      (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)&local_78,&local_48);
  local_68._M_head_impl = this_00;
  LogicalType::~LogicalType(&local_48);
  if (local_78._M_head_impl != (Expression *)0x0) {
    (*((local_78._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_78._M_head_impl = (Expression *)0x0;
  pBVar1 = unique_ptr<duckdb::BoundCastExpression,_std::default_delete<duckdb::BoundCastExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundCastExpression,_std::default_delete<duckdb::BoundCastExpression>,_true>
                         *)&local_68);
  Deserializer::ReadPropertyWithDefault<bool>(deserializer,0xca,"try_cast",&pBVar1->try_cast);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_68._M_head_impl;
  LogicalType::~LogicalType(&local_60);
  if (local_70 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_70 + 8))();
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundCastExpression::Deserialize(Deserializer &deserializer) {
	auto child = deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(200, "child");
	auto return_type = deserializer.ReadProperty<LogicalType>(201, "return_type");
	auto result = duckdb::unique_ptr<BoundCastExpression>(new BoundCastExpression(deserializer.Get<ClientContext &>(), std::move(child), std::move(return_type)));
	deserializer.ReadPropertyWithDefault<bool>(202, "try_cast", result->try_cast);
	return std::move(result);
}